

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_signature_map_entry.c
# Opt level: O0

apx_error_t
apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change
          (apx_portSignatureMapEntry_t *self,apx_portInstance_t *require_port,
          apx_portConnectorEvent_t event_type)

{
  apx_portInstance_t *self_00;
  int32_t iVar1;
  apx_portId_t aVar2;
  apx_nodeInstance_tag *paVar3;
  code *pcVar4;
  apx_portConnectorChangeTable_t *paVar5;
  apx_portConnectorChangeEntry_t *paVar6;
  apx_portConnectorChangeEntry_t *paVar7;
  apx_portInstance_t *provide_port;
  apx_portConnectorChangeEntry_t *provide_port_change_entry;
  apx_portConnectorChangeTable_t *provide_port_change_table;
  apx_portConnectorChangeEntry_actionFunc *action_func;
  apx_portConnectorChangeEntry_t *require_port_change_entry;
  apx_portConnectorChangeTable_t *require_port_change_table;
  adt_list_elem_t *iter;
  apx_error_t retval;
  apx_portConnectorEvent_t event_type_local;
  apx_portInstance_t *require_port_local;
  apx_portSignatureMapEntry_t *self_local;
  
  if (((self == (apx_portSignatureMapEntry_t *)0x0) || (require_port == (apx_portInstance_t *)0x0))
     || ((event_type != '\0' && (event_type != '\x01')))) {
    self_local._4_4_ = 1;
  }
  else {
    iter._0_4_ = 0;
    iVar1 = adt_list_length(&self->provide_ports);
    if (0 < iVar1) {
      paVar3 = apx_portInstance_parent(require_port);
      if (paVar3 == (apx_nodeInstance_tag *)0x0) {
        __assert_fail("apx_portInstance_parent(require_port) != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map_entry.c"
                      ,0x116,
                      "apx_error_t apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(apx_portSignatureMapEntry_t *, apx_portInstance_t *, apx_portConnectorEvent_t)"
                     );
      }
      pcVar4 = apx_portConnectorChangeEntry_remove_connection;
      if (event_type == '\0') {
        pcVar4 = apx_portConnectorChangeEntry_add_connection;
      }
      paVar3 = apx_portInstance_parent(require_port);
      paVar5 = apx_nodeInstance_get_require_port_connector_changes(paVar3,true);
      if (paVar5 == (apx_portConnectorChangeTable_t *)0x0) {
        __assert_fail("require_port_change_table != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map_entry.c"
                      ,0x11b,
                      "apx_error_t apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(apx_portSignatureMapEntry_t *, apx_portInstance_t *, apx_portConnectorEvent_t)"
                     );
      }
      aVar2 = apx_portInstance_port_id(require_port);
      paVar6 = apx_portConnectorChangeTable_get_entry(paVar5,aVar2);
      if (paVar6 == (apx_portConnectorChangeEntry_t *)0x0) {
        __assert_fail("require_port_change_entry != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map_entry.c"
                      ,0x11d,
                      "apx_error_t apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(apx_portSignatureMapEntry_t *, apx_portInstance_t *, apx_portConnectorEvent_t)"
                     );
      }
      for (require_port_change_table =
                (apx_portConnectorChangeTable_t *)adt_list_iter_first(&self->provide_ports);
          require_port_change_table != (apx_portConnectorChangeTable_t *)0x0;
          require_port_change_table =
               (apx_portConnectorChangeTable_t *)
               adt_list_iter_next((adt_list_elem_t *)require_port_change_table)) {
        self_00 = (apx_portInstance_t *)require_port_change_table[1].entries;
        if (self_00 == (apx_portInstance_t *)0x0) {
          __assert_fail("provide_port != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map_entry.c"
                        ,0x124,
                        "apx_error_t apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(apx_portSignatureMapEntry_t *, apx_portInstance_t *, apx_portConnectorEvent_t)"
                       );
        }
        paVar3 = apx_portInstance_parent(self_00);
        if (paVar3 == (apx_nodeInstance_tag *)0x0) {
          __assert_fail("apx_portInstance_parent(provide_port) != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map_entry.c"
                        ,0x125,
                        "apx_error_t apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(apx_portSignatureMapEntry_t *, apx_portInstance_t *, apx_portConnectorEvent_t)"
                       );
        }
        paVar3 = apx_portInstance_parent(self_00);
        paVar5 = apx_nodeInstance_get_provide_port_connector_changes(paVar3,true);
        if (paVar5 == (apx_portConnectorChangeTable_t *)0x0) {
          __assert_fail("provide_port_change_table != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map_entry.c"
                        ,0x127,
                        "apx_error_t apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(apx_portSignatureMapEntry_t *, apx_portInstance_t *, apx_portConnectorEvent_t)"
                       );
        }
        aVar2 = apx_portInstance_port_id(self_00);
        paVar7 = apx_portConnectorChangeTable_get_entry(paVar5,aVar2);
        if (paVar7 == (apx_portConnectorChangeEntry_t *)0x0) {
          __assert_fail("provide_port_change_entry != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map_entry.c"
                        ,0x129,
                        "apx_error_t apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(apx_portSignatureMapEntry_t *, apx_portInstance_t *, apx_portConnectorEvent_t)"
                       );
        }
        iter._0_4_ = (*pcVar4)(paVar6,self_00);
        if ((int)iter == 0) {
          iter._0_4_ = (*pcVar4)(paVar7,require_port);
        }
        if ((int)iter != 0) break;
      }
    }
    self_local._4_4_ = (int)iter;
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(apx_portSignatureMapEntry_t* self, apx_portInstance_t* require_port, apx_portConnectorEvent_t event_type)
{
   if ( (self != NULL) && (require_port != NULL) && ( (event_type == APX_PORT_CONNECTED_EVENT) || (event_type == APX_PORT_DISCONNECTED_EVENT) ) )
   {
      apx_error_t retval = APX_NO_ERROR;
      if (adt_list_length(&self->provide_ports) > 0)
      {
         adt_list_elem_t *iter;
         apx_portConnectorChangeTable_t *require_port_change_table;
         apx_portConnectorChangeEntry_t *require_port_change_entry;
         apx_portConnectorChangeEntry_actionFunc *action_func;
         assert(apx_portInstance_parent(require_port) != NULL);

         action_func = (event_type == APX_PORT_CONNECTED_EVENT)? apx_portConnectorChangeEntry_add_connection : apx_portConnectorChangeEntry_remove_connection;

         require_port_change_table = apx_nodeInstance_get_require_port_connector_changes(apx_portInstance_parent(require_port), true);
         assert(require_port_change_table != NULL);
         require_port_change_entry = apx_portConnectorChangeTable_get_entry(require_port_change_table, apx_portInstance_port_id(require_port));
         assert(require_port_change_entry != NULL);

         for(iter = adt_list_iter_first(&self->provide_ports); iter != NULL; iter = adt_list_iter_next(iter))
         {
            apx_portConnectorChangeTable_t *provide_port_change_table;
            apx_portConnectorChangeEntry_t *provide_port_change_entry;
            apx_portInstance_t *provide_port = (apx_portInstance_t*) iter->pItem;
            assert(provide_port != NULL);
            assert(apx_portInstance_parent(provide_port) != NULL);
            provide_port_change_table = apx_nodeInstance_get_provide_port_connector_changes(apx_portInstance_parent(provide_port), true);
            assert(provide_port_change_table != 0);
            provide_port_change_entry = apx_portConnectorChangeTable_get_entry(provide_port_change_table, apx_portInstance_port_id(provide_port));
            assert(provide_port_change_entry != 0);
            retval = action_func(require_port_change_entry, provide_port);
            if (retval == APX_NO_ERROR)
            {
               retval = action_func(provide_port_change_entry, require_port);
            }
            if (retval != APX_NO_ERROR)
            {
               break;
            }

         }
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}